

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_adjust_q_from_delta_q_res(int delta_q_res,int prev_qindex,int curr_qindex)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int adjust_qindex;
  int abs_deltaq_index;
  int qmask;
  int deltaq_deadzone;
  int sign_deltaq_index;
  undefined4 local_24;
  
  iVar1 = clamp(in_EDX,in_EDI,0x100 - in_EDI);
  iVar2 = -1;
  if (-1 < iVar1 - in_ESI) {
    iVar2 = 1;
  }
  iVar1 = iVar1 - in_ESI;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  local_24 = in_ESI + iVar2 * (iVar1 + in_EDI / 4 & (in_EDI - 1U ^ 0xffffffff));
  if (local_24 < 2) {
    local_24 = 1;
  }
  return local_24;
}

Assistant:

int av1_adjust_q_from_delta_q_res(int delta_q_res, int prev_qindex,
                                  int curr_qindex) {
  curr_qindex = clamp(curr_qindex, delta_q_res, 256 - delta_q_res);
  const int sign_deltaq_index = curr_qindex - prev_qindex >= 0 ? 1 : -1;
  const int deltaq_deadzone = delta_q_res / 4;
  const int qmask = ~(delta_q_res - 1);
  int abs_deltaq_index = abs(curr_qindex - prev_qindex);
  abs_deltaq_index = (abs_deltaq_index + deltaq_deadzone) & qmask;
  int adjust_qindex = prev_qindex + sign_deltaq_index * abs_deltaq_index;
  adjust_qindex = AOMMAX(adjust_qindex, MINQ + 1);
  return adjust_qindex;
}